

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::AddGlobalLinkInformation(cmMakefile *this,cmTarget *target)

{
  cmStateSnapshot *this_00;
  pointer pcVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  cmTargetLinkLibraryType llt;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *d;
  pointer pbVar5;
  string newdir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkDirs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkLibs;
  string local_c0;
  undefined1 local_a0 [16];
  undefined1 local_90 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  cmMakefile *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if (2 < target->TargetTypeValue - UTILITY) {
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    local_50 = this;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"LINK_DIRECTORIES","");
    this_00 = &local_50->StateSnapshot;
    cmStateSnapshot::GetDirectory((cmStateDirectory *)local_a0,this_00);
    pcVar3 = cmStateDirectory::GetProperty((cmStateDirectory *)local_a0,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if (pcVar3 != (char *)0x0) {
      local_90._24_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      paStack_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
      local_68._M_allocated_capacity = 0;
      local_a0._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_90;
      sVar4 = strlen(pcVar3);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,pcVar3,pcVar3 + sVar4);
      cmSystemTools::ExpandListArgument
                ((string *)local_a0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_90 + 0x18),false);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_a0._0_8_ !=
          (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_90) {
        operator_delete((void *)local_a0._0_8_,(ulong)(local_90._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._24_8_ != paStack_70) {
        d = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._24_8_;
        do {
          local_a0._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_90;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_a0,d->_M_allocated_capacity,
                     *(long *)(d->_M_local_buf + 8) + d->_M_allocated_capacity);
          if (*(char *)((d->_M_allocated_capacity - 1) + *(long *)(d->_M_local_buf + 8)) == '/') {
            std::__cxx11::string::substr((ulong)&local_c0,(ulong)d);
            std::__cxx11::string::operator=((string *)local_a0,(string *)&local_c0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
            }
          }
          cmTarget::AddLinkDirectory(target,(string *)d);
          if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_a0._0_8_ !=
              (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_90) {
            operator_delete((void *)local_a0._0_8_,(ulong)(local_90._0_8_ + 1));
          }
          d = d + 2;
        } while (d != paStack_70);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_90 + 0x18));
    }
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"LINK_LIBRARIES","");
    cmStateSnapshot::GetDirectory((cmStateDirectory *)local_a0,this_00);
    pcVar3 = cmStateDirectory::GetProperty((cmStateDirectory *)local_a0,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if (pcVar3 != (char *)0x0) {
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a0._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_90;
      sVar4 = strlen(pcVar3);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,pcVar3,pcVar3 + sVar4);
      cmSystemTools::ExpandListArgument((string *)local_a0,&local_48,false);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_a0._0_8_ !=
          (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_90) {
        operator_delete((void *)local_a0._0_8_,(ulong)(local_90._0_8_ + 1));
      }
      if (local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar5 = local_48.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          pcVar1 = (pbVar5->_M_dataplus)._M_p;
          local_a0._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_90;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_a0,pcVar1,pcVar1 + pbVar5->_M_string_length);
          iVar2 = std::__cxx11::string::compare((char *)local_a0);
          if (iVar2 == 0) {
            pbVar5 = pbVar5 + 1;
            llt = OPTIMIZED_LibraryType;
            std::__cxx11::string::_M_assign((string *)local_a0);
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)local_a0);
            llt = GENERAL_LibraryType;
            if (iVar2 == 0) {
              pbVar5 = pbVar5 + 1;
              llt = DEBUG_LibraryType;
              std::__cxx11::string::_M_assign((string *)local_a0);
            }
          }
          cmTarget::AddLinkLibrary(target,local_50,(string *)local_a0,llt);
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c0,"INTERFACE_LINK_LIBRARIES","");
          cmTarget::GetDebugGeneratorExpressions
                    ((string *)(local_90 + 0x18),target,(string *)local_a0,llt);
          cmTarget::AppendProperty(target,&local_c0,(char *)local_90._24_8_,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._24_8_ != &local_68) {
            operator_delete((void *)local_90._24_8_,local_68._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_a0._0_8_ !=
              (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_90) {
            operator_delete((void *)local_a0._0_8_,(ulong)(local_90._0_8_ + 1));
          }
          pbVar5 = pbVar5 + 1;
        } while (pbVar5 != local_48.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
    }
  }
  return;
}

Assistant:

void cmMakefile::AddGlobalLinkInformation(cmTarget& target)
{
  // for these targets do not add anything
  switch (target.GetType()) {
    case cmStateEnums::UTILITY:
    case cmStateEnums::GLOBAL_TARGET:
    case cmStateEnums::INTERFACE_LIBRARY:
      return;
    default:;
  }
  if (const char* linkDirsProp = this->GetProperty("LINK_DIRECTORIES")) {
    std::vector<std::string> linkDirs;
    cmSystemTools::ExpandListArgument(linkDirsProp, linkDirs);

    for (std::vector<std::string>::iterator j = linkDirs.begin();
         j != linkDirs.end(); ++j) {
      std::string newdir = *j;
      // remove trailing slashes
      if (*j->rbegin() == '/') {
        newdir = j->substr(0, j->size() - 1);
      }
      target.AddLinkDirectory(*j);
    }
  }

  if (const char* linkLibsProp = this->GetProperty("LINK_LIBRARIES")) {
    std::vector<std::string> linkLibs;
    cmSystemTools::ExpandListArgument(linkLibsProp, linkLibs);

    for (std::vector<std::string>::iterator j = linkLibs.begin();
         j != linkLibs.end(); ++j) {
      std::string libraryName = *j;
      cmTargetLinkLibraryType libType = GENERAL_LibraryType;
      if (libraryName == "optimized") {
        libType = OPTIMIZED_LibraryType;
        ++j;
        libraryName = *j;
      } else if (libraryName == "debug") {
        libType = DEBUG_LibraryType;
        ++j;
        libraryName = *j;
      }
      // This is equivalent to the target_link_libraries plain signature.
      target.AddLinkLibrary(*this, libraryName, libType);
      target.AppendProperty(
        "INTERFACE_LINK_LIBRARIES",
        target.GetDebugGeneratorExpressions(libraryName, libType).c_str());
    }
  }
}